

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

void __thiscall QStackedLayout::setCurrentIndex(QStackedLayout *this,int index)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QStackedLayoutPrivate *pQVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  QWidget *this_00;
  QWidget *pQVar9;
  int in_ESI;
  int iVar10;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *nfw;
  bool focusWasOnOldPage;
  QWidget *parent;
  bool reenableUpdates;
  QWidget *next;
  QWidget *prev;
  QStackedLayoutPrivate *d;
  QWidget *i;
  QPointer<QWidget> fw;
  QWidget *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar11;
  QStackedLayout *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffb0;
  byte bVar12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QStackedLayout *)0x34f644);
  pQVar6 = currentWidget((QStackedLayout *)
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT24(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80))));
  pQVar7 = widget(in_stack_ffffffffffffff88,
                  CONCAT13(in_stack_ffffffffffffff87,
                           CONCAT12(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84)));
  uVar11 = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  if ((pQVar7 != (QWidget *)0x0) && (pQVar7 != pQVar6)) {
    bVar12 = 0;
    pQVar8 = QLayout::parentWidget((QLayout *)in_RDI);
    if ((pQVar8 != (QWidget *)0x0) && (bVar2 = QWidget::updatesEnabled((QWidget *)0x34f6aa), bVar2))
    {
      bVar12 = 1;
      QWidget::setUpdatesEnabled(in_RDI,(bool)uVar11);
    }
    if (pQVar8 == (QWidget *)0x0) {
      this_00 = (QWidget *)0x0;
    }
    else {
      QWidget::window(in_RDI);
      this_00 = QWidget::focusWidget((QWidget *)0x34f6f3);
    }
    iVar10 = (int)this_00;
    QPointer<QWidget>::QPointer<void>
              ((QPointer<QWidget> *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))),
               in_stack_ffffffffffffff78);
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x34f71c);
    uVar11 = false;
    bVar2 = (bool)uVar11;
    if ((bVar3) &&
       (in_stack_ffffffffffffff86 = false, bVar2 = (bool)in_stack_ffffffffffffff86,
       pQVar6 != (QWidget *)0x0)) {
      in_stack_ffffffffffffff78 = pQVar6;
      pQVar9 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x34f74c);
      iVar10 = (int)pQVar9;
      in_stack_ffffffffffffff86 =
           QWidget::isAncestorOf
                     (this_00,(QWidget *)
                              CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86,
                                                       CONCAT24(in_stack_ffffffffffffff84,
                                                                in_stack_ffffffffffffff80))));
      bVar2 = (bool)in_stack_ffffffffffffff86;
    }
    uVar11 = bVar2;
    if ((pQVar6 != (QWidget *)0x0) &&
       (QWidget::clearFocus((QWidget *)CONCAT17(bVar12,in_stack_ffffffffffffffb0)),
       pQVar5->stackingMode == StackOne)) {
      QWidget::hide((QWidget *)0x34f798);
    }
    pQVar5->index = in_ESI;
    QWidget::raise(pQVar7,iVar10);
    QWidget::show(in_RDI);
    if ((pQVar8 != (QWidget *)0x0) && (bVar2 != false)) {
      pQVar6 = QWidget::focusWidget((QWidget *)0x34f7de);
      if (pQVar6 == (QWidget *)0x0) {
        pQVar7 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x34f804);
        if (pQVar7 != (QWidget *)0x0) {
          do {
            pQVar7 = QWidget::nextInFocusChain
                               ((QWidget *)
                                CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86,
                                                         CONCAT24(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80))));
            bVar2 = ::operator!=((QWidget **)
                                 CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86,
                                                          CONCAT24(in_stack_ffffffffffffff84,
                                                                   in_stack_ffffffffffffff80))),
                                 (QPointer<QWidget> *)in_stack_ffffffffffffff78);
            if (!bVar2) goto LAB_0034f8a8;
            FVar4 = QWidget::focusPolicy(pQVar7);
          } while (((((FVar4 & TabFocus) != TabFocus) ||
                    (pQVar7 = QWidget::focusProxy((QWidget *)
                                                  CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86
                                                                           ,CONCAT24(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                    pQVar7 != (QWidget *)0x0)) ||
                   (bVar2 = QWidget::isVisibleTo(pQVar6,in_RDI), !bVar2)) ||
                  ((bVar2 = QWidget::isEnabled((QWidget *)0x34f87c), !bVar2 ||
                   (bVar2 = QWidget::isAncestorOf
                                      (this_00,(QWidget *)
                                               CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86,
                                                                        CONCAT24(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))), !bVar2))));
          QWidget::setFocus((QWidget *)0x34f8a1);
LAB_0034f8a8:
          bVar2 = ::operator==((QWidget **)
                               CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff86,
                                                        CONCAT24(in_stack_ffffffffffffff84,
                                                                 in_stack_ffffffffffffff80))),
                               (QPointer<QWidget> *)in_stack_ffffffffffffff78);
          if (bVar2) {
            QWidget::setFocus((QWidget *)0x34f8c7);
          }
        }
      }
      else {
        QWidget::setFocus((QWidget *)0x34f7f5);
      }
    }
    iVar10 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if ((bVar12 & 1) != 0) {
      QWidget::setUpdatesEnabled(in_RDI,SUB81((ulong)this_00 >> 0x38,0));
    }
    currentChanged((QStackedLayout *)0x34f8f3,iVar10);
    QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x34f8fd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setCurrentIndex(int index)
{
    Q_D(QStackedLayout);
    QWidget *prev = currentWidget();
    QWidget *next = widget(index);
    if (!next || next == prev)
        return;

    bool reenableUpdates = false;
    QWidget *parent = parentWidget();

    if (parent && parent->updatesEnabled()) {
        reenableUpdates = true;
        parent->setUpdatesEnabled(false);
    }

    QPointer<QWidget> fw = parent ? parent->window()->focusWidget() : nullptr;
    const bool focusWasOnOldPage = fw && (prev && prev->isAncestorOf(fw));

    if (prev) {
        prev->clearFocus();
        if (d->stackingMode == StackOne)
            prev->hide();
    }

    d->index = index;
    next->raise();
    next->show();

    // try to move focus onto the incoming widget if focus
    // was somewhere on the outgoing widget.

    if (parent) {
        if (focusWasOnOldPage) {
            // look for the best focus widget we can find
            if (QWidget *nfw = next->focusWidget())
                nfw->setFocus();
            else {
                // second best: first child widget in the focus chain
                if (QWidget *i = fw) {
                    while ((i = i->nextInFocusChain()) != fw) {
                        if (((i->focusPolicy() & Qt::TabFocus) == Qt::TabFocus)
                            && !i->focusProxy() && i->isVisibleTo(next) && i->isEnabled()
                            && next->isAncestorOf(i)) {
                            i->setFocus();
                            break;
                        }
                    }
                    // third best: incoming widget
                    if (i == fw )
                        next->setFocus();
                }
            }
        }
    }
    if (reenableUpdates)
        parent->setUpdatesEnabled(true);
    emit currentChanged(index);
}